

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_body(void)

{
  player_body *ppVar1;
  int local_1c;
  wchar_t i;
  player_body *next;
  player_body *b;
  
  next = bodies;
  while (next != (player_body *)0x0) {
    ppVar1 = next->next;
    string_free(next->name);
    for (local_1c = 0; local_1c < (int)(uint)next->count; local_1c = local_1c + 1) {
      string_free(next->slots[local_1c].name);
    }
    mem_free(next->slots);
    mem_free(next);
    next = ppVar1;
  }
  return;
}

Assistant:

static void cleanup_body(void)
{
	struct player_body *b = bodies;
	struct player_body *next;
	int i;

	while (b) {
		next = b->next;
		string_free((char *)b->name);
		for (i = 0; i < b->count; i++)
			string_free((char *)b->slots[i].name);
		mem_free(b->slots);
		mem_free(b);
		b = next;
	}
}